

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcones2qc.h
# Opt level: O2

Context __thiscall
mp::
QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Convert(QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,ItemType *ac,int param_2)

{
  pointer __src;
  double *pdVar1;
  double dVar2;
  double dVar3;
  int var;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
  *pFVar4;
  double *coef;
  pointer pdVar5;
  CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  *v1;
  Arguments x0;
  Parameters c;
  LinTerms local_c98;
  LinTerms local_c20;
  QuadConLE qc;
  QuadTerms local_9c8;
  QuadTerms local_888;
  QuadAndLinTerms local_748;
  QuadAndLinTerms local_590;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> local_3d8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> local_1f8;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&c,&(ac->
                 super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
                 ).params_);
  for (pdVar5 = c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar5 != c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
    *pdVar5 = *pdVar5 * *pdVar5;
  }
  dVar2 = *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       -dVar2;
  this_00 = &((this->
              super_BasicFuncConstrCvt<mp::QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ).
              super_BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             .mdl_cvt_)->
             super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ;
  v1 = &ac->
        super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  ;
  var = *(ac->
         super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
         ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  dVar3 = (this_00->super_FlatModel<mp::DefaultFlatModelParams>).var_lb_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[var];
  pdVar1 = (this_00->super_FlatModel<mp::DefaultFlatModelParams>).var_ub_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start + var;
  if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) {
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::NarrowVarBounds(this_00,var,0.0,INFINITY);
    local_c20.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_c20.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage
    ;
    local_c20.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[0]
         = (type)0x0;
    local_c20.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[1]
         = (type)0x0;
    local_c20.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[2]
         = (type)0x0;
    local_c20.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3]
         = (type)0x0;
    local_c20.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[4]
         = (type)0x0;
    local_c20.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[5]
         = (type)0x0;
    local_c20.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_c20.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[0] =
         (type)0x0;
    local_c20.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[1] =
         (type)0x0;
    local_c20.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[2] =
         (type)0x0;
    local_c20.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[3] =
         (type)0x0;
    local_c20.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[4] =
         (type)0x0;
    local_c20.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[5] =
         (type)0x0;
    local_c20.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_c20.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_c20.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_c20.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_c20.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    QuadTerms::QuadTerms(&local_888,&c,&v1->args_,&v1->args_);
    QuadAndLinTerms::QuadAndLinTerms(&local_590,&local_c20,&local_888);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&qc,&local_590,(AlgConRhs<_1>)0x0,true);
    QuadAndLinTerms::~QuadAndLinTerms(&local_590);
    QuadTerms::~QuadTerms(&local_888);
    LinTerms::~LinTerms(&local_c20);
    pFVar4 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
              *)(this->
                super_BasicFuncConstrCvt<mp::QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ).
                super_BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                .mdl_cvt_;
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&local_1f8,&qc);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
              (pFVar4,&local_1f8);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&local_1f8);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&qc);
  }
  else {
    pdVar5 = c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    if (pdVar5 != c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      memmove(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,pdVar5,
              (long)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar5);
    }
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    std::vector<int,_std::allocator<int>_>::vector(&x0,&v1->args_);
    __src = x0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + 1;
    if (__src != x0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish) {
      memmove(x0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start,__src,
              (long)x0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_finish - (long)__src);
    }
    x0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         x0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         + -1;
    local_c98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_c98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage
    ;
    local_c98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[0]
         = (type)0x0;
    local_c98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[1]
         = (type)0x0;
    local_c98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[2]
         = (type)0x0;
    local_c98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3]
         = (type)0x0;
    local_c98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[4]
         = (type)0x0;
    local_c98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[5]
         = (type)0x0;
    local_c98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_c98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[0] =
         (type)0x0;
    local_c98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[1] =
         (type)0x0;
    local_c98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[2] =
         (type)0x0;
    local_c98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[3] =
         (type)0x0;
    local_c98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[4] =
         (type)0x0;
    local_c98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[5] =
         (type)0x0;
    local_c98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_c98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_c98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_c98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_c98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    QuadTerms::QuadTerms(&local_9c8,&c,&x0,&x0);
    QuadAndLinTerms::QuadAndLinTerms(&local_748,&local_c98,&local_9c8);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&qc,&local_748,(AlgConRhs<_1>)(dVar2 * dVar3),true);
    QuadAndLinTerms::~QuadAndLinTerms(&local_748);
    QuadTerms::~QuadTerms(&local_9c8);
    LinTerms::~LinTerms(&local_c98);
    pFVar4 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
              *)(this->
                super_BasicFuncConstrCvt<mp::QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ).
                super_BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                .mdl_cvt_;
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&local_3d8,&qc);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
              (pFVar4,&local_3d8);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&local_3d8);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&qc);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&x0.super__Vector_base<int,_std::allocator<int>_>);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&c.super__Vector_base<double,_std::allocator<double>_>);
  return (Context)CTX_ROOT;
}

Assistant:

Context Convert(const ItemType& ac, int ) {
    const auto& x = ac.GetArguments();
    auto c = ac.GetParameters();
    for (auto& coef: c)
      coef *= coef;
    c[0] = -c[0];
    if (!GetMC().is_fixed(x[0])) {
      GetMC().NarrowVarBounds(x[0], 0.0, GetMC().Infty());
      auto qc {QuadConLE{ {{}, {c, x, x}}, {0.0} }};
      GetMC().AddConstraint(std::move(qc));
    } else {
      // Reproduce fixed RHS, better for Mosek & COPT. conic/socp_10
      auto rhs = -c[0] * GetMC().fixed_value(x[0]);
      c.erase(c.begin());
      auto x0 = x;
      x0.erase(x0.begin());
      auto qc {QuadConLE{ {{}, {c, x0, x0}}, {rhs} }};
      GetMC().AddConstraint(std::move(qc));
    }
    return Context::CTX_ROOT;
  }